

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_hatetarget.cpp
# Opt level: O0

void AHateTarget::InPlaceConstructor(void *mem)

{
  AHateTarget *this;
  void *mem_local;
  
  this = (AHateTarget *)DObject::operator_new(0x4a0,(EInPlace *)mem);
  AHateTarget(this);
  return;
}

Assistant:

void AHateTarget::BeginPlay()
{
	Super::BeginPlay();
	if (SpawnAngle != 0)
	{	// Each degree translates into 10 units of health
		health = SpawnAngle * 10;
	}
	else
	{
		special2 = 1;
		health = 1000001;
	}
}